

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
* __thiscall
Parser::parse(vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
              *__return_storage_ptr__,Parser *this)

{
  value_type local_60;
  unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_> local_58;
  unique_ptr<Statement,_std::default_delete<Statement>_> local_50 [3];
  Token local_38;
  TokenKind local_20;
  undefined1 local_19;
  TokenKind lookaheadType;
  Parser *this_local;
  vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  *statements;
  
  local_19 = 0;
  _lookaheadType = this;
  this_local = (Parser *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ::vector(__return_storage_ptr__);
  while( true ) {
    TokenStream::lookahead(&local_38,this->tokenStream);
    local_20 = local_38.type;
    if (local_38.type == EndOfFile) break;
    if (local_38.type == LeftBracket) {
      loop((Parser *)&local_58);
      std::unique_ptr<Statement,std::default_delete<Statement>>::
      unique_ptr<LoopStatement,std::default_delete<LoopStatement>,void>
                ((unique_ptr<Statement,std::default_delete<Statement>> *)local_50,&local_58);
      std::
      vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_50);
      std::unique_ptr<Statement,_std::default_delete<Statement>_>::~unique_ptr(local_50);
      std::unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_>::~unique_ptr(&local_58);
    }
    else {
      single((Parser *)&local_60);
      std::
      vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
      ::push_back(__return_storage_ptr__,&local_60);
      std::unique_ptr<Statement,_std::default_delete<Statement>_>::~unique_ptr(&local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto Parser::parse() -> std::vector<std::unique_ptr<Statement>> {
    auto statements = std::vector<std::unique_ptr<Statement>>();

    while (true) {
        auto lookaheadType = tokenStream.lookahead().type;

        if (lookaheadType == TokenKind::EndOfFile)
            break;

        if (lookaheadType == TokenKind::LeftBracket)
            statements.push_back(loop());
        else statements.push_back(single());
    }

    return statements;
}